

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenWorkItem.cpp
# Opt level: O2

bool __thiscall CodeGenWorkItem::ShouldSpeculativelyJitBasedOnProfile(CodeGenWorkItem *this)

{
  FunctionBody *this_00;
  SourceDynamicProfileManager *this_01;
  ExecutionFlags EVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  LocalFunctionId functionId;
  SourceContextInfo *pSVar6;
  
  this_00 = this->functionBody;
  uVar2 = Js::FunctionBody::GetByteCodeInLoopCount(this_00);
  uVar3 = Js::FunctionBody::GetByteCodeCount(this_00);
  uVar4 = Js::FunctionBody::GetByteCodeCount(this_00);
  uVar5 = Js::FunctionBody::GetByteCodeInLoopCount(this_00);
  if ((0x31 < (uVar2 * 100) / (uVar3 + 1)) || (uVar4 - uVar5 < 300)) {
    pSVar6 = Js::FunctionProxy::GetSourceContextInfo((FunctionProxy *)this_00);
    this_01 = (pSVar6->sourceDynamicProfileManager).ptr;
    if ((this_01 != (SourceDynamicProfileManager *)0x0) &&
       (Js::FunctionBody::SetIsSpeculativeJitCandidate(this_00),
       (this_00->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0)) {
      functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_00);
      EVar1 = Js::SourceDynamicProfileManager::IsFunctionExecuted(this_01,functionId);
      return EVar1 == ExecutionFlags_Executed;
    }
  }
  return false;
}

Assistant:

bool CodeGenWorkItem::ShouldSpeculativelyJitBasedOnProfile() const
{
    Js::FunctionBody* functionBody = this->GetFunctionBody();

    uint loopPercentage = (functionBody->GetByteCodeInLoopCount()*100) / (functionBody->GetByteCodeCount() + 1);
    uint straightLineSize = functionBody->GetByteCodeCount() - functionBody->GetByteCodeInLoopCount();

    // This ensures only small and loopy functions are prejitted.
    if(loopPercentage >= 50 || straightLineSize < 300)
    {
        Js::SourceDynamicProfileManager* profileManager = functionBody->GetSourceContextInfo()->sourceDynamicProfileManager;
        if(profileManager != nullptr)
        {
            functionBody->SetIsSpeculativeJitCandidate();

            if(!functionBody->HasDynamicProfileInfo())
            {
                return false;
            }

            Js::ExecutionFlags executionFlags = profileManager->IsFunctionExecuted(functionBody->GetLocalFunctionId());
            if(executionFlags == Js::ExecutionFlags_Executed)
            {
                return true;
            }
        }
    }
    return false;
}